

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

vector<CLI::App_*,_std::allocator<CLI::App_*>_> * __thiscall
CLI::App::get_subcommands
          (vector<CLI::App_*,_std::allocator<CLI::App_*>_> *__return_storage_ptr__,App *this,
          function<bool_(CLI::App_*)> *filter)

{
  pointer psVar1;
  pointer psVar2;
  __normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_> _Var3;
  pointer ppAVar4;
  allocator_type local_19;
  
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector
            (__return_storage_ptr__,
             (long)(this->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,&local_19);
  psVar2 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar2 != psVar1) {
    ppAVar4 = (__return_storage_ptr__->super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    do {
      *ppAVar4 = (psVar2->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      psVar2 = psVar2 + 1;
      ppAVar4 = ppAVar4 + 1;
    } while (psVar2 != psVar1);
  }
  if ((filter->super__Function_base)._M_manager != (_Manager_type)0x0) {
    _Var3 = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<CLI::App**,std::vector<CLI::App*,std::allocator<CLI::App*>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::get_subcommands(std::function<bool(CLI::App*)>const&)::_lambda(CLI::App*)_1_>>
                      ((__normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
                        )(__return_storage_ptr__->
                         super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>)._M_impl.
                         super__Vector_impl_data._M_start,
                       (__normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
                        )(__return_storage_ptr__->
                         super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>)._M_impl.
                         super__Vector_impl_data._M_finish,
                       (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_dcoeurjo[P]axisampling_CLI11_hpp:5072:74)>
                        )filter);
    if (_Var3._M_current !=
        (__return_storage_ptr__->super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      (__return_storage_ptr__->super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = _Var3._M_current;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<App *> get_subcommands(const std::function<bool(App *)> &filter) {
        std::vector<App *> subcomms(subcommands_.size());
        std::transform(std::begin(subcommands_), std::end(subcommands_), std::begin(subcomms), [](const App_p &v) {
            return v.get();
        });

        if(filter) {
            subcomms.erase(
                std::remove_if(std::begin(subcomms), std::end(subcomms), [&filter](App *app) { return !filter(app); }),
                std::end(subcomms));
        }

        return subcomms;
    }